

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram.c
# Opt level: O0

int next_word_cmp(void *o1,void *o2)

{
  uint32_t p2;
  uint32_t p1;
  void *o2_local;
  void *o1_local;
  
  if (*(uint *)((long)o2 + 4) < *(uint *)((long)o1 + 4)) {
    o1_local._4_4_ = 1;
  }
  else if (*(uint *)((long)o1 + 4) < *(uint *)((long)o2 + 4)) {
    o1_local._4_4_ = -1;
  }
  else {
    o1_local._4_4_ = 0;
  }
  return o1_local._4_4_;
}

Assistant:

int next_word_cmp(const void* o1, const void* o2){
    uint32_t p1 = ((NextWordResult_T*)o1)->prob;
    uint32_t p2 = ((NextWordResult_T*)o2)->prob;
    if (p1 > p2) {
        return 1;
    }else if(p1 < p2){
        return -1;
    }
    return 0;
}